

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O0

int CVodeGetLinWorkSpace(void *cvode_mem,long *lenrwLS,long *leniwLS)

{
  int iVar1;
  long *in_RDX;
  long *in_RSI;
  int retval;
  long liw;
  long lrw;
  sunindextype liw1;
  sunindextype lrw1;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long *local_20;
  long *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_4 = cvLs_AccessLMem(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                            (CVodeMem *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            (CVLsMem *)0x13c5ce);
  if (local_4 == 0) {
    *local_18 = 2;
    *local_20 = 0x1e;
    if (*(long *)(*(long *)(*(long *)(local_28 + 0x1d0) + 8) + 0x20) != 0) {
      N_VSpace(*(undefined8 *)(local_28 + 0x1d0),&local_38,&local_40);
      *local_18 = local_38 * 2 + *local_18;
      *local_20 = local_40 * 2 + *local_20;
    }
    if (((*(long *)(local_30 + 0x58) != 0) &&
        (*(long *)(*(long *)(*(long *)(local_30 + 0x58) + 8) + 0x48) != 0)) &&
       (iVar1 = SUNMatSpace(*(undefined8 *)(local_30 + 0x58),&stack0xffffffffffffffb8,
                            &stack0xffffffffffffffb0), iVar1 == 0)) {
      *local_18 = (long)in_stack_ffffffffffffffb8 + *local_18;
      *local_20 = (long)(in_stack_ffffffffffffffb0 + *local_20);
    }
    if ((*(long *)(*(long *)(*(long *)(local_30 + 0x48) + 8) + 0x60) != 0) &&
       (iVar1 = SUNLinSolSpace(*(undefined8 *)(local_30 + 0x48),&stack0xffffffffffffffb8,
                               &stack0xffffffffffffffb0), iVar1 == 0)) {
      *local_18 = (long)in_stack_ffffffffffffffb8 + *local_18;
      *local_20 = (long)(in_stack_ffffffffffffffb0 + *local_20);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeGetLinWorkSpace(void* cvode_mem, long int* lenrwLS, long int* leniwLS)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  sunindextype lrw1, liw1;
  long int lrw, liw;
  int retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* start with fixed sizes plus vector/matrix pointers */
  *lenrwLS = 2;
  *leniwLS = 30;

  /* add NVector sizes */
  if (cv_mem->cv_tempv->ops->nvspace)
  {
    N_VSpace(cv_mem->cv_tempv, &lrw1, &liw1);
    *lenrwLS += 2 * lrw1;
    *leniwLS += 2 * liw1;
  }

  /* add SUNMatrix size (only account for the one owned by Ls interface) */
  if (cvls_mem->savedJ)
  {
    if (cvls_mem->savedJ->ops->space)
    {
      retval = SUNMatSpace(cvls_mem->savedJ, &lrw, &liw);
      if (retval == 0)
      {
        *lenrwLS += lrw;
        *leniwLS += liw;
      }
    }
  }

  /* add LS sizes */
  if (cvls_mem->LS->ops->space)
  {
    retval = SUNLinSolSpace(cvls_mem->LS, &lrw, &liw);
    if (retval == 0)
    {
      *lenrwLS += lrw;
      *leniwLS += liw;
    }
  }

  return (CVLS_SUCCESS);
}